

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_callback_all_protocol(lws_context *context,lws_protocols *protocol,int reason)

{
  lws *plVar1;
  lws *wsi;
  uint m;
  uint n;
  lws_context_per_thread *pt;
  int reason_local;
  lws_protocols *protocol_local;
  lws_context *context_local;
  
  _m = context->pt;
  wsi._0_4_ = (int)context->count_threads;
  while ((int)wsi != 0) {
    for (wsi._4_4_ = 0; wsi._4_4_ < _m->fds_count; wsi._4_4_ = wsi._4_4_ + 1) {
      plVar1 = wsi_from_fd(context,_m->fds[wsi._4_4_].fd);
      if ((plVar1 != (lws *)0x0) && (plVar1->protocol == protocol)) {
        (*protocol->callback)(plVar1,reason,plVar1->user_space,(void *)0x0,0);
      }
    }
    _m = _m + 1;
    wsi._0_4_ = (int)wsi + -1;
  }
  return 0;
}

Assistant:

int
lws_callback_all_protocol(struct lws_context *context,
			  const struct lws_protocols *protocol, int reason)
{
	struct lws_context_per_thread *pt = &context->pt[0];
	unsigned int n, m = context->count_threads;
	struct lws *wsi;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->protocol == protocol)
				protocol->callback(wsi, reason, wsi->user_space,
						   NULL, 0);
		}
		pt++;
	}

	return 0;
}